

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O0

int __thiscall QNetworkReplyFileImpl::close(QNetworkReplyFileImpl *this,int __fd)

{
  bool bVar1;
  IfNotOldStyleArgs<bool> IVar2;
  int iVar3;
  QNetworkReplyFileImplPrivate *member;
  undefined7 extraout_var;
  long lVar4;
  long lVar5;
  QFile *pQVar6;
  undefined7 extraout_var_00;
  QNetworkReplyFileImplPrivate *d;
  ConnectionType c;
  QNetworkReplyFileImpl *obj;
  
  obj = this;
  member = d_func((QNetworkReplyFileImpl *)0x1e753c);
  QNetworkReply::close((QNetworkReply *)this,__fd);
  c = (ConnectionType)((ulong)this >> 0x20);
  bVar1 = QPointer::operator_cast_to_bool((QPointer<QFile> *)0x1e755c);
  iVar3 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    QPointer<QFile>::operator->((QPointer<QFile> *)0x1e7573);
    lVar4 = QObject::thread();
    lVar5 = QObject::thread();
    if (lVar4 == lVar5) {
      pQVar6 = QPointer<QFile>::operator->((QPointer<QFile> *)0x1e75a8);
      iVar3 = (**(code **)(*(long *)pQVar6 + 0x70))();
    }
    else {
      QPointer::operator_cast_to_QFile_((QPointer<QFile> *)0x1e75c4);
      IVar2 = QMetaObject::invokeMethod<>((QObject *)obj,(char *)member,c);
      iVar3 = (int)CONCAT71(extraout_var_00,IVar2);
    }
  }
  return iVar3;
}

Assistant:

void QNetworkReplyFileImpl::close()
{
    Q_D(QNetworkReplyFileImpl);
    QNetworkReply::close();
    if (d->realFile) {
        if (d->realFile->thread() == thread())
            d->realFile->close();
        else
            QMetaObject::invokeMethod(d->realFile, "close", Qt::QueuedConnection);
    }
}